

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fruit.cpp
# Opt level: O3

ostream * L13_4::operator<<(ostream *os,Banana *b)

{
  char *__s;
  size_t sVar1;
  
  operator<<(os,&b->super_Fruit);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Style: ",7);
  __s = b->_style;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, const Banana &b) {
        os << (const Fruit &) b;
        os << "Style: " << b._style << std::endl;
        return os;
    }